

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O0

char * __thiscall
Memory::
PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
::TryAllocFromZeroPagesList
          (PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
           *this,uint pageCount,
          PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> **pageSegment,
          BackgroundPageQueue *bgPageQueue,bool isPendingZeroList)

{
  uint pageCount_00;
  FreePageEntry *pFVar1;
  PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *segment_00;
  code *pcVar2;
  bool bVar3;
  DWORD DVar4;
  DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>
  *fromSegmentList_00;
  undefined4 *puVar5;
  ThreadContextId pvVar6;
  size_t local_88;
  FreePageEntry *local_78;
  DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>
  *fromSegmentList;
  PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *segment;
  FreePageEntry *freePagesEntry;
  uint newFreePages;
  FreePageEntry *freePage;
  FreePageEntry *localList;
  char *pages;
  bool isPendingZeroList_local;
  BackgroundPageQueue *bgPageQueue_local;
  PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> **pageSegment_local;
  uint pageCount_local;
  PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
  *this_local;
  
  localList = (FreePageEntry *)0x0;
  freePage = (FreePageEntry *)0x0;
  if ((DAT_01eca380 & 1) != 0) {
    do {
      if (isPendingZeroList) {
        local_78 = ZeroPageQueue::PopZeroPageEntry((ZeroPageQueue *)this->backgroundPageQueue);
      }
      else {
        local_78 = BackgroundPageQueue::PopFreePageEntry(this->backgroundPageQueue);
      }
      if (local_78 == (FreePageEntry *)0x0) goto LAB_0098a188;
      if (local_78->pageCount == pageCount) {
        *pageSegment = local_78->segment;
        localList = local_78;
        if (isPendingZeroList) {
          local_88 = (size_t)(pageCount << 0xc);
        }
        else {
          local_88 = 0x18;
        }
        memset(local_78,0,local_88);
        FillAllocPages(this,local_78,pageCount);
        goto LAB_0098a188;
      }
      if (isPendingZeroList) {
        memset(local_78 + 1,0,(ulong)(local_78->pageCount << 0xc) - 0x18);
      }
      local_78->Next = freePage;
      freePage = local_78;
    } while (local_78->pageCount <= pageCount);
    *pageSegment = local_78->segment;
    local_78->pageCount = local_78->pageCount - pageCount;
    localList = (FreePageEntry *)((long)&local_78->Next + (ulong)(local_78->pageCount << 0xc));
    FillAllocPages(this,localList,pageCount);
  }
LAB_0098a188:
  if (freePage != (FreePageEntry *)0x0) {
    freePagesEntry._4_4_ = 0;
    while (freePage != (FreePageEntry *)0x0) {
      pFVar1 = freePage->Next;
      segment_00 = freePage->segment;
      pageCount_00 = freePage->pageCount;
      fromSegmentList_00 = GetSegmentList(this,segment_00);
      if (fromSegmentList_00 ==
          (DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount> *)
          0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                           ,0x3b2,"(fromSegmentList != nullptr)","fromSegmentList != nullptr");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      memset(freePage,0,0x18);
      PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>::ReleasePages
                (segment_00,freePage,pageCount_00);
      freePagesEntry._4_4_ = pageCount_00 + freePagesEntry._4_4_;
      TransferSegment(this,segment_00,fromSegmentList_00);
      freePage = pFVar1;
    }
    LogFreePages(this,(ulong)freePagesEntry._4_4_);
    bVar3 = Js::Phases::IsEnabled(&this->pageAllocatorFlagTable->Trace,PageAllocatorPhase);
    if ((bVar3) && ((this->pageAllocatorFlagTable->Verbose & 1U) != 0)) {
      pvVar6 = GetCurrentThreadContextId();
      DVar4 = GetCurrentThreadId();
      Output::Print(L"%p : %p> PageAllocator(%p): ",pvVar6,(ulong)DVar4,this);
      if (this->debugName != (char16 *)0x0) {
        Output::Print(L"[%s] ",this->debugName);
      }
      Output::Print(L"New free pages: %d\n",(ulong)freePagesEntry._4_4_);
      Output::Print(L"\n");
      Output::Flush();
    }
    AddFreePageCount(this,freePagesEntry._4_4_);
    if (this->freePageCount < this->debugMinFreePageCount) {
      this->debugMinFreePageCount = this->freePageCount;
    }
  }
  return (char *)localList;
}

Assistant:

char *
PageAllocatorBase<TVirtualAlloc, TSegment, TPageSegment>::TryAllocFromZeroPagesList(
    uint pageCount, TPageSegment ** pageSegment, BackgroundPageQueue* bgPageQueue, bool isPendingZeroList)
{
    FAULTINJECT_MEMORY_NOTHROW(this->debugName, pageCount*AutoSystemInfo::PageSize);

    char * pages = nullptr;
    FreePageEntry* localList = nullptr;

#if ENABLE_BACKGROUND_PAGE_ZEROING
    if (CONFIG_FLAG(EnableBGFreeZero))
    {
        while (true)
        {
            FreePageEntry * freePage = isPendingZeroList ? ((ZeroPageQueue *)backgroundPageQueue)->PopZeroPageEntry() : backgroundPageQueue->PopFreePageEntry();
            if (freePage == nullptr)
            {
                break;
            }

            if (freePage->pageCount == pageCount)
            {
                *pageSegment = freePage->segment;
                pages = (char *)freePage;
                memset(pages, 0, isPendingZeroList ? (pageCount*AutoSystemInfo::PageSize) : sizeof(FreePageEntry));
                this->FillAllocPages(pages, pageCount);
                break;
            }
            else
            {
                if (isPendingZeroList)
                {
                    memset((char *)freePage + sizeof(FreePageEntry), 0, (freePage->pageCount*AutoSystemInfo::PageSize) - sizeof(FreePageEntry));
                }

                freePage->Next = localList;
                localList = (FreePageEntry*)freePage;

                if (freePage->pageCount > pageCount)
                {
                    *pageSegment = freePage->segment;
                    freePage->pageCount -= pageCount;
                    pages = (char *)freePage + freePage->pageCount * AutoSystemInfo::PageSize;
                    this->FillAllocPages(pages, pageCount);
                    break;
                }
            }
        }
    }
#endif

    if (localList != nullptr)
    {
        uint newFreePages = 0;
        while (localList != nullptr)
        {
            FreePageEntry* freePagesEntry = localList;
            localList = (FreePageEntry*)localList->Next;

            TPageSegment * segment = freePagesEntry->segment;
            pageCount = freePagesEntry->pageCount;

            DListBase<TPageSegment> * fromSegmentList = GetSegmentList(segment);
            Assert(fromSegmentList != nullptr);

            memset(freePagesEntry, 0, sizeof(FreePageEntry));

            segment->ReleasePages(freePagesEntry, pageCount);
            newFreePages += pageCount;

            TransferSegment(segment, fromSegmentList);

        }

        LogFreePages(newFreePages);
        PAGE_ALLOC_VERBOSE_TRACE(_u("New free pages: %d\n"), newFreePages);
        this->AddFreePageCount(newFreePages);
#if DBG
        UpdateMinimum(this->debugMinFreePageCount, this->freePageCount);
#endif
    }

    return pages;
}